

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

bool __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::operator!=
          (InputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *rhs)

{
  bool bVar1;
  __optional_eq_t<std::vector<std::array<double,_3UL>_>,_std::vector<std::array<double,_3UL>_>_>
  _Var2;
  __optional_eq_t<std::array<double,_3UL>,_std::array<double,_3UL>_> _Var3;
  __optional_eq_t<double,_double> _Var4;
  __optional_eq_t<std::vector<double>,_std::vector<double>_> _Var5;
  __optional_eq_t<std::array<ruckig::ControlInterface,_3UL>,_std::array<ruckig::ControlInterface,_3UL>_>
  _Var6;
  __optional_eq_t<std::array<ruckig::Synchronization,_3UL>,_std::array<ruckig::Synchronization,_3UL>_>
  local_19;
  InputParameter<3UL,_ruckig::StandardVector> *rhs_local;
  InputParameter<3UL,_ruckig::StandardVector> *this_local;
  
  bVar1 = std::operator==(&this->current_position,&rhs->current_position);
  local_19 = false;
  if (bVar1) {
    bVar1 = std::operator==(&this->current_velocity,&rhs->current_velocity);
    local_19 = false;
    if (bVar1) {
      bVar1 = std::operator==(&this->current_acceleration,&rhs->current_acceleration);
      local_19 = false;
      if (bVar1) {
        bVar1 = std::operator==(&this->target_position,&rhs->target_position);
        local_19 = false;
        if (bVar1) {
          bVar1 = std::operator==(&this->target_velocity,&rhs->target_velocity);
          local_19 = false;
          if (bVar1) {
            bVar1 = std::operator==(&this->target_acceleration,&rhs->target_acceleration);
            local_19 = false;
            if (bVar1) {
              bVar1 = std::operator==(&this->max_velocity,&rhs->max_velocity);
              local_19 = false;
              if (bVar1) {
                bVar1 = std::operator==(&this->max_acceleration,&rhs->max_acceleration);
                local_19 = false;
                if (bVar1) {
                  bVar1 = std::operator==(&this->max_jerk,&rhs->max_jerk);
                  local_19 = false;
                  if (bVar1) {
                    bVar1 = std::operator==(&this->intermediate_positions,
                                            &rhs->intermediate_positions);
                    local_19 = false;
                    if (bVar1) {
                      _Var2 = std::operator==(&this->per_section_max_velocity,
                                              &rhs->per_section_max_velocity);
                      local_19 = false;
                      if (_Var2) {
                        _Var2 = std::operator==(&this->per_section_max_acceleration,
                                                &rhs->per_section_max_acceleration);
                        local_19 = false;
                        if (_Var2) {
                          _Var2 = std::operator==(&this->per_section_max_jerk,
                                                  &rhs->per_section_max_jerk);
                          local_19 = false;
                          if (_Var2) {
                            _Var2 = std::operator==(&this->per_section_min_velocity,
                                                    &rhs->per_section_min_velocity);
                            local_19 = false;
                            if (_Var2) {
                              _Var2 = std::operator==(&this->per_section_min_acceleration,
                                                      &rhs->per_section_min_acceleration);
                              local_19 = false;
                              if (_Var2) {
                                _Var2 = std::operator==(&this->per_section_max_position,
                                                        &rhs->per_section_max_position);
                                local_19 = false;
                                if (_Var2) {
                                  _Var2 = std::operator==(&this->per_section_min_position,
                                                          &rhs->per_section_min_position);
                                  local_19 = false;
                                  if (_Var2) {
                                    _Var3 = std::operator==(&this->max_position,&rhs->max_position);
                                    local_19 = false;
                                    if (_Var3) {
                                      _Var3 = std::operator==(&this->min_position,&rhs->min_position
                                                             );
                                      local_19 = false;
                                      if (_Var3) {
                                        bVar1 = std::operator==(&this->enabled,&rhs->enabled);
                                        local_19 = false;
                                        if (bVar1) {
                                          _Var4 = std::operator==(&this->minimum_duration,
                                                                  &rhs->minimum_duration);
                                          local_19 = false;
                                          if (_Var4) {
                                            _Var5 = std::operator==(&this->
                                                  per_section_minimum_duration,
                                                  &rhs->per_section_minimum_duration);
                                            local_19 = false;
                                            if (_Var5) {
                                              _Var3 = std::operator==(&this->min_velocity,
                                                                      &rhs->min_velocity);
                                              local_19 = false;
                                              if (_Var3) {
                                                _Var3 = std::operator==(&this->min_acceleration,
                                                                        &rhs->min_acceleration);
                                                local_19 = false;
                                                if ((((_Var3) &&
                                                     (local_19 = false,
                                                     this->control_interface ==
                                                     rhs->control_interface)) &&
                                                    (local_19 = false,
                                                    this->synchronization == rhs->synchronization))
                                                   && (local_19 = false,
                                                      this->duration_discretization ==
                                                      rhs->duration_discretization)) {
                                                  _Var6 = std::operator==(&this->
                                                  per_dof_control_interface,
                                                  &rhs->per_dof_control_interface);
                                                  local_19 = false;
                                                  if (_Var6) {
                                                    local_19 = std::operator==(&this->
                                                  per_dof_synchronization,
                                                  &rhs->per_dof_synchronization);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)((local_19 ^ 0xffU) & 1);
}

Assistant:

bool operator!=(const InputParameter<DOFs, CustomVector>& rhs) const {
        return !(
            current_position == rhs.current_position
            && current_velocity == rhs.current_velocity
            && current_acceleration == rhs.current_acceleration
            && target_position == rhs.target_position
            && target_velocity == rhs.target_velocity
            && target_acceleration == rhs.target_acceleration
            && max_velocity == rhs.max_velocity
            && max_acceleration == rhs.max_acceleration
            && max_jerk == rhs.max_jerk
            && intermediate_positions == rhs.intermediate_positions
            && per_section_max_velocity == rhs.per_section_max_velocity
            && per_section_max_acceleration == rhs.per_section_max_acceleration
            && per_section_max_jerk == rhs.per_section_max_jerk
            && per_section_min_velocity == rhs.per_section_min_velocity
            && per_section_min_acceleration == rhs.per_section_min_acceleration
            && per_section_max_position == rhs.per_section_max_position
            && per_section_min_position == rhs.per_section_min_position
            && max_position == rhs.max_position
            && min_position == rhs.min_position
            && enabled == rhs.enabled
            && minimum_duration == rhs.minimum_duration
            && per_section_minimum_duration == rhs.per_section_minimum_duration
            && min_velocity == rhs.min_velocity
            && min_acceleration == rhs.min_acceleration
            && control_interface == rhs.control_interface
            && synchronization == rhs.synchronization
            && duration_discretization == rhs.duration_discretization
            && per_dof_control_interface == rhs.per_dof_control_interface
            && per_dof_synchronization == rhs.per_dof_synchronization
        );
    }